

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QtPrivate::argToQString
          (QString *__return_storage_ptr__,QtPrivate *this,QAnyStringView pattern,size_t numArgs,
          ArgBase **args)

{
  char cVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  ushort *puVar7;
  ulong uVar8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar9;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  char *pcVar10;
  long lVar11;
  char16_t *dst;
  long lVar12;
  char16_t *this_00;
  ulong uVar13;
  long lVar14;
  long in_FS_OFFSET;
  QByteArrayView in;
  qsizetype i;
  ArgIndexToPlaceholderMap result;
  ParseResult parts;
  QArrayDataPointer<char16_t> local_3f0;
  QMessageLogger local_3d8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_3b8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_3b0;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_3a8;
  ulong local_3a0;
  char *local_398;
  char local_390 [64];
  QVarLengthArray<(anonymous_namespace)::Part,_32LL> local_350;
  long local_38;
  __off_t extraout_RDX_01;
  
  uVar8 = pattern.m_size;
  aVar9 = pattern.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3b8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this;
  local_3b0 = aVar9;
  memset(&local_350,0xaa,0x318);
  uVar13 = (ulong)aVar9.m_data & 0x3fffffffffffffff;
  local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr =
       &local_350.super_QVLAStorage<24UL,_8UL,_32LL>;
  if (((ulong)aVar9.m_data & 0xc000000000000000) == 0x4000000000000000) {
    memset(local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr,0xaa,0x300);
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.a = 0x20;
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s = 0;
    lVar14 = 0;
    lVar12 = 0;
    lVar11 = 0;
    while (local_3d8.context._0_8_ = lVar12, lVar14 < (long)(uVar13 - 1)) {
      local_3d8.context._0_8_ = lVar14;
      if (this[lVar14] == (QtPrivate)0x25) {
        local_3d8.context._0_8_ = lVar12;
        iVar4 = getEscape<char>((char *)this,(qsizetype *)&local_3d8,uVar13);
        if (iVar4 == -1) goto LAB_002f832a;
        lVar2 = local_3d8.context._0_8_;
        if (lVar14 - lVar11 != 0) {
          local_3a8.m_data = this + lVar11;
          local_3a0 = lVar14 - lVar11 | 0x4000000000000000;
          local_398 = (char *)CONCAT44(local_398._4_4_,0xffffffff);
          QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
                    (&local_350,(Part *)&local_3a8);
          lVar2 = local_3d8.context._0_8_;
        }
        local_3a8.m_data = this + lVar14;
        local_3a0 = lVar2 - lVar14 | 0x4000000000000000;
        local_398 = (char *)CONCAT44(local_398._4_4_,iVar4);
        local_3d8.context._0_8_ = lVar2;
        QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8)
        ;
        lVar14 = lVar2;
        lVar12 = local_3d8.context._0_8_;
        lVar11 = lVar2;
      }
      else {
LAB_002f832a:
        lVar14 = local_3d8.context._0_8_ + 1;
        lVar12 = local_3d8.context._0_8_ + 1;
      }
    }
    if (uVar13 - lVar11 != 0 && lVar11 <= (long)uVar13) {
      local_3a8.m_data = this + lVar11;
      local_3a0 = uVar13 - lVar11 | 0x4000000000000000;
      local_398 = (char *)CONCAT44(local_398._4_4_,0xffffffff);
      QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8);
    }
  }
  else {
    memset(local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr,0xaa,0x300);
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.a = 0x20;
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s = 0;
    lVar14 = 0;
    lVar12 = 0;
    lVar11 = 0;
    while (local_3d8.context._0_8_ = lVar12, lVar14 < (long)(uVar13 - 1)) {
      local_3d8.context._0_8_ = lVar14;
      if (this[lVar14] == (QtPrivate)0x25) {
        local_3d8.context._0_8_ = lVar12;
        iVar4 = getEscape<char>((char *)this,(qsizetype *)&local_3d8,uVar13);
        if (iVar4 == -1) goto LAB_002f8431;
        local_3a0 = lVar14 - lVar11;
        lVar2 = local_3d8.context._0_8_;
        if (local_3a0 != 0) {
          local_3a8.m_data = this + lVar11;
          local_398 = (char *)CONCAT44(local_398._4_4_,0xffffffff);
          QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
                    (&local_350,(Part *)&local_3a8);
          lVar2 = local_3d8.context._0_8_;
        }
        local_3a8.m_data = this + lVar14;
        local_3a0 = lVar2 - lVar14;
        local_398 = (char *)CONCAT44(local_398._4_4_,iVar4);
        local_3d8.context._0_8_ = lVar2;
        QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8)
        ;
        lVar14 = lVar2;
        lVar12 = local_3d8.context._0_8_;
        lVar11 = lVar2;
      }
      else {
LAB_002f8431:
        lVar14 = local_3d8.context._0_8_ + 1;
        lVar12 = local_3d8.context._0_8_ + 1;
      }
    }
    local_3a0 = uVar13 - lVar11;
    if (local_3a0 != 0 && lVar11 <= (long)uVar13) {
      local_3a8.m_data = this + lVar11;
      local_398 = (char *)CONCAT44(local_398._4_4_,0xffffffff);
      QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8);
    }
  }
  local_398 = local_390;
  local_390[0x30] = -0x56;
  local_390[0x31] = -0x56;
  local_390[0x32] = -0x56;
  local_390[0x33] = -0x56;
  local_390[0x34] = -0x56;
  local_390[0x35] = -0x56;
  local_390[0x36] = -0x56;
  local_390[0x37] = -0x56;
  local_390[0x38] = -0x56;
  local_390[0x39] = -0x56;
  local_390[0x3a] = -0x56;
  local_390[0x3b] = -0x56;
  local_390[0x3c] = -0x56;
  local_390[0x3d] = -0x56;
  local_390[0x3e] = -0x56;
  local_390[0x3f] = -0x56;
  local_390[0x20] = -0x56;
  local_390[0x21] = -0x56;
  local_390[0x22] = -0x56;
  local_390[0x23] = -0x56;
  local_390[0x24] = -0x56;
  local_390[0x25] = -0x56;
  local_390[0x26] = -0x56;
  local_390[0x27] = -0x56;
  local_390[0x28] = -0x56;
  local_390[0x29] = -0x56;
  local_390[0x2a] = -0x56;
  local_390[0x2b] = -0x56;
  local_390[0x2c] = -0x56;
  local_390[0x2d] = -0x56;
  local_390[0x2e] = -0x56;
  local_390[0x2f] = -0x56;
  local_390[0x10] = -0x56;
  local_390[0x11] = -0x56;
  local_390[0x12] = -0x56;
  local_390[0x13] = -0x56;
  local_390[0x14] = -0x56;
  local_390[0x15] = -0x56;
  local_390[0x16] = -0x56;
  local_390[0x17] = -0x56;
  local_390[0x18] = -0x56;
  local_390[0x19] = -0x56;
  local_390[0x1a] = -0x56;
  local_390[0x1b] = -0x56;
  local_390[0x1c] = -0x56;
  local_390[0x1d] = -0x56;
  local_390[0x1e] = -0x56;
  local_390[0x1f] = -0x56;
  local_390[0] = -0x56;
  local_390[1] = -0x56;
  local_390[2] = -0x56;
  local_390[3] = -0x56;
  local_390[4] = -0x56;
  local_390[5] = -0x56;
  local_390[6] = -0x56;
  local_390[7] = -0x56;
  local_390[8] = -0x56;
  local_390[9] = -0x56;
  local_390[10] = -0x56;
  local_390[0xb] = -0x56;
  local_390[0xc] = -0x56;
  local_390[0xd] = -0x56;
  local_390[0xe] = -0x56;
  local_390[0xf] = -0x56;
  local_3a8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x10;
  local_3a0 = 0;
  pcVar10 = (char *)local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr +
            0x10;
  for (lVar12 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
      lVar12 != 0; lVar12 = lVar12 + -0x18) {
    if (-1 < *(int *)pcVar10) {
      QVarLengthArray<int,_16LL>::append((QVarLengthArray<int,_16LL> *)&local_3a8,(int *)pcVar10);
    }
    pcVar10 = pcVar10 + 0x18;
  }
  std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(local_398,local_398 + local_3a0 * 4);
  piVar5 = std::__unique<int*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (local_398,local_398 + local_3a0 * 4);
  QVLABase<int>::erase
            ((QVLABase<int> *)&local_3a8,piVar5,(const_iterator)(local_398 + local_3a0 * 4));
  uVar13 = local_3a0;
  if (uVar8 < local_3a0) {
    QVarLengthArray<int,_16LL>::resize((QVarLengthArray<int,_16LL> *)&local_3a8,uVar8);
  }
  else if (local_3a0 < uVar8) {
    local_3d8.context.version = 2;
    local_3d8.context.function._4_4_ = 0;
    local_3d8.context.line = 0;
    local_3d8.context.file._0_4_ = 0;
    local_3d8.context._12_8_ = 0;
    local_3d8.context.category = "default";
    QAnyStringView::toString((QString *)&local_3f0,(QAnyStringView *)&local_3b8);
    puVar7 = QString::utf16((QString *)&local_3f0);
    QMessageLogger::warning
              (&local_3d8,"QString::arg: %d argument(s) missing in %ls",
               (ulong)(uint)((int)pattern.m_size - (int)uVar13),puVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3f0);
  }
  pcVar10 = (char *)local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr +
            0x10;
  lVar12 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
  lVar14 = 0;
  do {
    if (lVar12 == 0) {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString(__return_storage_ptr__,lVar14,Uninitialized);
      pvVar3 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr;
      this_00 = (__return_storage_ptr__->d).ptr;
      if ((QUtf8 *)this_00 == (QUtf8 *)0x0) {
        this_00 = L"";
      }
      lVar12 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
      __length = extraout_RDX;
      for (lVar14 = 0; lVar12 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
        uVar8 = *(ulong *)((char *)pvVar3 + lVar14 + 8);
        if ((uVar8 & 0xc000000000000000) == 0x4000000000000000) {
          if ((uVar8 & 0x3fffffffffffffff) != 0) {
            qt_from_latin1(this_00,*(char **)((char *)pvVar3 + lVar14),uVar8 & 0x3fffffffffffffff);
            __length = extraout_RDX_00;
          }
          this_00 = (char16_t *)((long)this_00 + (uVar8 & 0x3fffffffffffffff) * 2);
        }
        else {
          in.m_data = (storage_type *)0x4000000000000000;
          in.m_size = *(qsizetype *)((char *)pvVar3 + lVar14);
          this_00 = QUtf8::convertToUnicode
                              ((QUtf8 *)this_00,(char16_t *)(uVar8 & 0x3fffffffffffffff),in);
          __length = extraout_RDX_01;
        }
      }
      QString::truncate(__return_storage_ptr__,
                        (char *)((long)this_00 - (long)(__return_storage_ptr__->d).ptr >> 1),
                        __length);
      QVarLengthArray<int,_16LL>::~QVarLengthArray((QVarLengthArray<int,_16LL> *)&local_3a8);
      QVarLengthArray<(anonymous_namespace)::Part,_32LL>::~QVarLengthArray(&local_350);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    if (*(int *)pcVar10 != -1) {
      piVar5 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (local_398,local_398 + local_3a0 * 4,pcVar10);
      if (piVar5 != (int *)(local_398 + local_3a0 * 4)) {
        pcVar6 = *(char **)(numArgs + ((long)piVar5 - (long)local_398) * 2);
        cVar1 = *pcVar6;
        if (cVar1 == '\x02') {
          uVar8 = *(ulong *)(pcVar6 + 8) | 0x8000000000000000;
LAB_002f86e5:
          pcVar6 = pcVar6 + 0x10;
        }
        else {
          if (cVar1 != '\x01') {
            if (cVar1 != '\0') goto LAB_002f86f6;
            uVar8 = *(ulong *)(pcVar6 + 8) | 0x4000000000000000;
            goto LAB_002f86e5;
          }
          uVar8 = *(ulong *)(pcVar6 + 0x10);
          pcVar6 = pcVar6 + 8;
        }
        *(undefined8 *)((QVLAStorage<24UL,_8UL,_32LL> *)(pcVar10 + -0x10))->array =
             *(undefined8 *)pcVar6;
        *(ulong *)(pcVar10 + -8) = uVar8;
      }
    }
LAB_002f86f6:
    lVar14 = lVar14 + (*(ulong *)(pcVar10 + -8) & 0x3fffffffffffffff);
    pcVar10 = pcVar10 + 0x18;
    lVar12 = lVar12 + -0x18;
  } while( true );
}

Assistant:

QString QtPrivate::argToQString(QAnyStringView pattern, size_t numArgs, const ArgBase **args)
{
    // Step 1-2 above
    ParseResult parts = parseMultiArgFormatString(pattern);

    // 3-4
    ArgIndexToPlaceholderMap argIndexToPlaceholderMap = makeArgIndexToPlaceholderMap(parts);

    if (static_cast<size_t>(argIndexToPlaceholderMap.size()) > numArgs) // 3a
        argIndexToPlaceholderMap.resize(qsizetype(numArgs));
    else if (Q_UNLIKELY(static_cast<size_t>(argIndexToPlaceholderMap.size()) < numArgs)) // 3b
        qWarning("QString::arg: %d argument(s) missing in %ls",
                 int(numArgs - argIndexToPlaceholderMap.size()), qUtf16Printable(pattern.toString()));

    // 5
    const qsizetype totalSize = resolveStringRefsAndReturnTotalSize(parts, argIndexToPlaceholderMap, args);

    // 6:
    QString result(totalSize, Qt::Uninitialized);
    auto out = const_cast<QChar*>(result.constData());

    struct Concatenate {
        QChar *out;
        QChar *operator()(QLatin1String part) noexcept
        {
            if (part.size()) {
                qt_from_latin1(reinterpret_cast<char16_t*>(out),
                               part.data(), part.size());
            }
            return out + part.size();
        }
        QChar *operator()(QUtf8StringView part) noexcept
        {
            return QUtf8::convertToUnicode(out, part);
        }
        QChar *operator()(QStringView part) noexcept
        {
            if (part.size())
                memcpy(out, part.data(), part.size() * sizeof(QChar));
            return out + part.size();
        }
    };

    for (const Part &part : parts)
        out = part.string.visit(Concatenate{out});

    // UTF-8 decoding may have caused an overestimate of totalSize - correct it:
    result.truncate(out - result.cbegin());

    return result;
}